

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroup::updateDirection(QSequentialAnimationGroup *this,Direction direction)

{
  State SVar1;
  parameter_type pQVar2;
  QAbstractAnimation *in_RDI;
  QSequentialAnimationGroupPrivate *d;
  
  d_func((QSequentialAnimationGroup *)0x68aea0);
  SVar1 = QAbstractAnimation::state(in_RDI);
  if (SVar1 != Stopped) {
    pQVar2 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                       ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                         *)0x68aec5);
    if (pQVar2 != (parameter_type)0x0) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                    *)in_RDI);
      QAbstractAnimation::setDirection((QAbstractAnimation *)this,direction);
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QSequentialAnimationGroup);
    // we need to update the direction of the current animation
    if (state() != Stopped && d->currentAnimation)
        d->currentAnimation->setDirection(direction);
}